

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

int __thiscall
FOptionMenuItemOptionBase::Draw
          (FOptionMenuItemOptionBase *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  FBaseCVar *pFVar1;
  int iVar2;
  uint uVar3;
  FOptionValues **ppFVar4;
  long lVar5;
  char *string;
  undefined8 uVar6;
  byte bVar7;
  FName local_34;
  
  pFVar1 = this->mGrayCheck;
  if (pFVar1 == (FBaseCVar *)0x0) {
    bVar7 = 0;
  }
  else {
    iVar2 = (*pFVar1->_vptr_FBaseCVar[4])(pFVar1,0);
    bVar7 = (byte)iVar2 ^ 1;
  }
  if (this->mCenter != 0) {
    indent = (screen->super_DSimpleCanvas).super_DCanvas.Width / 2;
  }
  lVar5 = 4;
  if (selected) {
    lVar5 = 0x18;
  }
  FOptionMenuItem::drawLabel
            (&this->super_FOptionMenuItem,indent,y,
             *(EColorRange *)((long)&OptionSettings.mTitleColor + lVar5),(bool)(bVar7 & 1));
  uVar3 = (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])(this);
  ppFVar4 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
            CheckKey(&OptionValues,&local_34);
  string = "Unknown";
  if ((ppFVar4 != (FOptionValues **)0x0 && -1 < (int)uVar3) && (*ppFVar4 != (FOptionValues *)0x0)) {
    string = ((*ppFVar4)->mValues).Array[uVar3].Text.Chars;
  }
  if (*string == '$') {
    string = FStringTable::operator()(&GStrings,string + 1);
  }
  uVar6 = 0x60300000;
  if ((bVar7 & 1) == 0) {
    uVar6 = 0;
  }
  DCanvas::DrawText((DCanvas *)screen,SmallFont,OptionSettings.mFontColorValue,
                    CleanXfac_1 * 0xe + indent,y,string,0x40001394,1,0x400013aa,uVar6,0);
  return indent;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		bool grayed = mGrayCheck != NULL && !(mGrayCheck->GetGenericRep(CVAR_Bool).Bool);

		if (mCenter)
		{
			indent = (screen->GetWidth() / 2);
		}
		drawLabel(indent, y, selected? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, grayed);

		int overlay = grayed? MAKEARGB(96,48,0,0) : 0;
		const char *text;
		int Selection = GetSelection();
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (Selection < 0 || opt == NULL || *opt == NULL)
		{
			text = "Unknown";
		}
		else
		{
			text = (*opt)->mValues[Selection].Text;
		}
		if (*text == '$') text = GStrings(text + 1);
		screen->DrawText (SmallFont, OptionSettings.mFontColorValue, indent + CURSORSPACE, y, 
			text, DTA_CleanNoMove_1, true, DTA_ColorOverlay, overlay, TAG_DONE);
		return indent;
	}